

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

FastPattern *
trieste::detail::FastPattern::match_choice
          (FastPattern *__return_storage_ptr__,FastPattern *lhs,FastPattern *rhs)

{
  bool bVar1;
  iterator __first;
  byte local_119;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_118;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_e8;
  _Base_ptr local_b8;
  _Rb_tree_const_iterator<trieste::Token> local_b0;
  undefined1 local_a8 [8];
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> new_parent;
  undefined1 local_58 [8];
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> new_first;
  bool new_pass_through;
  FastPattern *rhs_local;
  FastPattern *lhs_local;
  
  local_119 = 1;
  if ((lhs->pass_through & 1U) == 0) {
    local_119 = rhs->pass_through;
  }
  new_first._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = local_119 & 1;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_58);
  bVar1 = any_first(rhs);
  if (!bVar1) {
    bVar1 = any_first(lhs);
    if (!bVar1) {
      std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
      operator=((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                local_58,&lhs->starts);
      __first = std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                ::begin((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                         *)rhs);
      new_parent._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
                   end((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                        *)rhs);
      std::set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>>::
      insert<std::_Rb_tree_const_iterator<trieste::Token>>
                ((set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>> *)
                 local_58,(_Rb_tree_const_iterator<trieste::Token>)__first._M_node,
                 (_Rb_tree_const_iterator<trieste::Token>)
                 new_parent._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_0014e178;
    }
  }
  new_first._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
LAB_0014e178:
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_a8);
  bVar1 = std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
          empty((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                &rhs->parents);
  if (!bVar1) {
    bVar1 = std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
            empty((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *
                  )&lhs->parents);
    if (!bVar1) {
      std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
      operator=((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                local_a8,&lhs->parents);
      local_b0._M_node =
           (_Base_ptr)
           std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
           begin((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                 &rhs->parents);
      local_b8 = (_Base_ptr)
                 std::
                 set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
                 end((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                      *)&rhs->parents);
      std::set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>>::
      insert<std::_Rb_tree_const_iterator<trieste::Token>>
                ((set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>> *)
                 local_a8,local_b0,(_Rb_tree_const_iterator<trieste::Token>)local_b8);
    }
  }
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_e8,
             (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_58);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118,
             (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_a8);
  FastPattern(__return_storage_ptr__,&local_e8,&local_118,
              (bool)(new_first._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1));
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_e8);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_a8);
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             local_58);
  return __return_storage_ptr__;
}

Assistant:

static FastPattern
      match_choice(const FastPattern& lhs, const FastPattern& rhs)
      {
        bool new_pass_through = lhs.pass_through || rhs.pass_through;
        std::set<Token> new_first;
        // any_first is annihilator for choice, so special cases required.
        // otherwise, we treat it as union
        if (!rhs.any_first() && !lhs.any_first())
        {
          new_first = lhs.starts;
          new_first.insert(rhs.starts.begin(), rhs.starts.end());
        }
        else
        {
          // Any first is true of one disjunct, so set pass_through to
          // false, and first to empty, to continue the any_first property.
          new_pass_through = false;
        }

        std::set<Token> new_parent;
        // Empty is treat as universal parent, so maintain universal
        // otherwise, we treat it as union
        if (!rhs.parents.empty() && !lhs.parents.empty())
        {
          new_parent = lhs.parents;
          new_parent.insert(rhs.parents.begin(), rhs.parents.end());
        }

        return FastPattern(new_first, new_parent, new_pass_through);
      }